

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ExceptionOr<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::~ExceptionOr
          (ExceptionOr<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *this)

{
  ExceptionOr<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *this_local;
  
  Maybe<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::~Maybe(&this->value);
  ExceptionOrValue::~ExceptionOrValue(&this->super_ExceptionOrValue);
  return;
}

Assistant:

ExceptionOr() = default;